

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O3

void run_ixor_test(void)

{
  _Bool _Var1;
  uint uVar2;
  array_container_t *container;
  array_container_t *container_00;
  array_container_t *container_01;
  array_container_t *container_02;
  array_container_t *container_03;
  bitset_container_t *src_2;
  bitset_container_t *src_2_00;
  bitset_container_t *src_2_01;
  run_container_t *run;
  run_container_t *run_00;
  run_container_t *run_01;
  uint16_t *puVar3;
  run_container_t *prVar4;
  bitset_container_t *pbVar5;
  array_container_t *paVar6;
  run_container_t *prVar7;
  ushort uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ushort uVar12;
  int x;
  uint uVar13;
  int iVar14;
  uint16_t pos;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  unsigned_long uVar18;
  container_t *C;
  array_container_t *local_50;
  bitset_container_t *local_48;
  run_container_t *local_40;
  unsigned_long local_38;
  
  container = array_container_create();
  container_00 = array_container_create();
  container_01 = array_container_create();
  container_02 = array_container_create();
  container_03 = array_container_create();
  src_2 = bitset_container_create();
  src_2_00 = bitset_container_create();
  src_2_01 = bitset_container_create();
  local_48 = bitset_container_create();
  run = run_container_create();
  run_00 = run_container_create();
  run_01 = run_container_create();
  uVar11 = 0;
  local_40 = run_container_create();
  do {
    uVar8 = (ushort)uVar11;
    if ((ushort)(uVar8 + (short)(((uint)uVar11 & 0xffff) / 5) * -5) < 3) {
      iVar14 = container->cardinality;
      if (((long)iVar14 == 0) ||
         ((puVar3 = container->array, iVar14 != 0x7fffffff && (puVar3[(long)iVar14 + -1] < uVar8))))
      {
        if (iVar14 == container->capacity) {
          array_container_grow(container,iVar14 + 1,true);
          iVar14 = container->cardinality;
        }
        container->cardinality = iVar14 + 1;
        container->array[iVar14] = uVar8;
      }
      else {
        if (iVar14 < 1) {
          uVar17 = 0;
        }
        else {
          iVar9 = iVar14 + -1;
          uVar17 = 0;
          do {
            uVar2 = iVar9 + (int)uVar17;
            uVar13 = uVar2 >> 1;
            uVar12 = *(ushort *)((long)puVar3 + (ulong)(uVar2 & 0xfffffffe));
            if (uVar12 < uVar8) {
              uVar17 = (ulong)(uVar13 + 1);
            }
            else {
              if (uVar12 <= uVar8) goto LAB_0010506b;
              iVar9 = uVar13 - 1;
            }
          } while ((int)uVar17 <= iVar9);
          if (iVar14 == 0x7fffffff) goto LAB_0010506b;
        }
        if (iVar14 == container->capacity) {
          array_container_grow(container,iVar14 + 1,true);
          puVar3 = container->array;
        }
        memmove(puVar3 + uVar17 + 1,puVar3 + uVar17,(long)(iVar14 - (int)uVar17) * 2);
        container->array[uVar17] = uVar8;
        container->cardinality = container->cardinality + 1;
      }
LAB_0010506b:
      uVar17 = src_2->words[uVar11 >> 6];
      uVar16 = uVar17 | 1L << (uVar11 & 0x3f);
      src_2->cardinality = src_2->cardinality + (int)((uVar17 ^ uVar16) >> ((byte)uVar11 & 0x3f));
      src_2->words[uVar11 >> 6] = uVar16;
      run_container_add(run,uVar8);
    }
    uVar13 = (uint)uVar11 + 1;
    uVar11 = (ulong)uVar13;
  } while (uVar13 != 0x10000);
  uVar11 = 0;
  do {
    uVar8 = (ushort)uVar11;
    uVar13 = (uint)((uVar11 & 0xffff) >> 1) / 0x1f;
    if ((ushort)(((short)uVar13 * 2 - (short)(uVar13 << 6)) + uVar8) < 0x25) {
      iVar14 = container_00->cardinality;
      if (((long)iVar14 == 0) ||
         ((puVar3 = container_00->array, iVar14 != 0x7fffffff && (puVar3[(long)iVar14 + -1] < uVar8)
          ))) {
        if (iVar14 == container_00->capacity) {
          array_container_grow(container_00,iVar14 + 1,true);
          iVar14 = container_00->cardinality;
        }
        container_00->cardinality = iVar14 + 1;
        container_00->array[iVar14] = uVar8;
      }
      else {
        if (iVar14 < 1) {
          uVar17 = 0;
        }
        else {
          iVar9 = iVar14 + -1;
          uVar17 = 0;
          do {
            uVar2 = iVar9 + (int)uVar17;
            uVar13 = uVar2 >> 1;
            uVar12 = *(ushort *)((long)puVar3 + (ulong)(uVar2 & 0xfffffffe));
            if (uVar12 < uVar8) {
              uVar17 = (ulong)(uVar13 + 1);
            }
            else {
              if (uVar12 <= uVar8) goto LAB_001051b2;
              iVar9 = uVar13 - 1;
            }
          } while ((int)uVar17 <= iVar9);
          if (iVar14 == 0x7fffffff) goto LAB_001051b2;
        }
        if (iVar14 == container_00->capacity) {
          array_container_grow(container_00,iVar14 + 1,true);
          puVar3 = container_00->array;
        }
        memmove(puVar3 + uVar17 + 1,puVar3 + uVar17,(long)(iVar14 - (int)uVar17) * 2);
        container_00->array[uVar17] = uVar8;
        container_00->cardinality = container_00->cardinality + 1;
      }
LAB_001051b2:
      uVar17 = src_2_00->words[uVar11 >> 6];
      uVar16 = uVar17 | 1L << (uVar11 & 0x3f);
      src_2_00->cardinality =
           src_2_00->cardinality + (int)((uVar17 ^ uVar16) >> ((byte)uVar11 & 0x3f));
      src_2_00->words[uVar11 >> 6] = uVar16;
      run_container_add(run_00,uVar8);
    }
    uVar13 = (int)uVar11 + 1;
    uVar11 = (ulong)uVar13;
  } while (uVar13 != 0x10000);
  uVar11 = 0;
  do {
    uVar8 = (ushort)uVar11;
    uVar13 = (uint)uVar11 & 0xffff;
    uVar2 = uVar13 / 0x3e;
    if ((ushort)(((short)uVar2 * 2 - (short)(uVar2 << 6)) + uVar8) < 0x25 !=
        (ushort)(uVar8 + (short)(uVar13 / 5) * -5) < 3) {
      iVar14 = container_03->cardinality;
      if (((long)iVar14 == 0) ||
         ((puVar3 = container_03->array, iVar14 != 0x7fffffff && (puVar3[(long)iVar14 + -1] < uVar8)
          ))) {
        if (iVar14 == container_03->capacity) {
          array_container_grow(container_03,iVar14 + 1,true);
          iVar14 = container_03->cardinality;
        }
        container_03->cardinality = iVar14 + 1;
        container_03->array[iVar14] = uVar8;
      }
      else {
        if (iVar14 < 1) {
          uVar17 = 0;
        }
        else {
          iVar9 = iVar14 + -1;
          uVar17 = 0;
          do {
            uVar2 = iVar9 + (int)uVar17;
            uVar13 = uVar2 >> 1;
            uVar12 = *(ushort *)((long)puVar3 + (ulong)(uVar2 & 0xfffffffe));
            if (uVar12 < uVar8) {
              uVar17 = (ulong)(uVar13 + 1);
            }
            else {
              if (uVar12 <= uVar8) goto LAB_00105314;
              iVar9 = uVar13 - 1;
            }
          } while ((int)uVar17 <= iVar9);
          if (iVar14 == 0x7fffffff) goto LAB_00105314;
        }
        if (iVar14 == container_03->capacity) {
          array_container_grow(container_03,iVar14 + 1,true);
          puVar3 = container_03->array;
        }
        memmove(puVar3 + uVar17 + 1,puVar3 + uVar17,(long)(iVar14 - (int)uVar17) * 2);
        container_03->array[uVar17] = uVar8;
        container_03->cardinality = container_03->cardinality + 1;
      }
LAB_00105314:
      uVar17 = local_48->words[uVar11 >> 6];
      uVar16 = uVar17 | 1L << (uVar11 & 0x3f);
      local_48->cardinality =
           local_48->cardinality + (int)((uVar17 ^ uVar16) >> ((byte)uVar11 & 0x3f));
      local_48->words[uVar11 >> 6] = uVar16;
    }
    uVar13 = (uint)uVar11 + 1;
    uVar11 = (ulong)uVar13;
  } while (uVar13 != 0x10000);
  uVar11 = 0;
  do {
    uVar12 = (ushort)uVar11;
    uVar13 = (uint)uVar11;
    uVar8 = uVar12 + (short)((uVar13 & 0xffff) / 5) * -5;
    if ((uVar8 < 2) || (10000 < uVar13 && uVar8 == 2)) {
      iVar14 = container_01->cardinality;
      if (((long)iVar14 == 0) ||
         ((puVar3 = container_01->array, iVar14 != 0x7fffffff &&
          (puVar3[(long)iVar14 + -1] < uVar12)))) {
        if (iVar14 == container_01->capacity) {
          array_container_grow(container_01,iVar14 + 1,true);
          iVar14 = container_01->cardinality;
        }
        container_01->cardinality = iVar14 + 1;
        container_01->array[iVar14] = uVar12;
      }
      else {
        if (iVar14 < 1) {
          uVar17 = 0;
        }
        else {
          iVar9 = iVar14 + -1;
          uVar17 = 0;
          do {
            uVar15 = iVar9 + (int)uVar17;
            uVar2 = uVar15 >> 1;
            uVar8 = *(ushort *)((long)puVar3 + (ulong)(uVar15 & 0xfffffffe));
            if (uVar8 < uVar12) {
              uVar17 = (ulong)(uVar2 + 1);
            }
            else {
              if (uVar8 <= uVar12) goto LAB_00105451;
              iVar9 = uVar2 - 1;
            }
          } while ((int)uVar17 <= iVar9);
          if (iVar14 == 0x7fffffff) goto LAB_00105451;
        }
        if (iVar14 == container_01->capacity) {
          array_container_grow(container_01,iVar14 + 1,true);
          puVar3 = container_01->array;
        }
        memmove(puVar3 + uVar17 + 1,puVar3 + uVar17,(long)(iVar14 - (int)uVar17) * 2);
        container_01->array[uVar17] = uVar12;
        container_01->cardinality = container_01->cardinality + 1;
      }
LAB_00105451:
      uVar17 = src_2_01->words[uVar11 >> 6];
      uVar16 = uVar17 | 1L << (uVar11 & 0x3f);
      src_2_01->cardinality =
           src_2_01->cardinality + (int)((uVar17 ^ uVar16) >> ((byte)uVar11 & 0x3f));
      src_2_01->words[uVar11 >> 6] = uVar16;
      run_container_add(run_01,uVar12);
    }
    uVar11 = (ulong)(uVar13 + 1);
  } while (uVar13 + 1 != 0x10000);
  uVar13 = 1;
  iVar14 = 0;
  do {
    if ((uVar13 & 3) != 0) {
      pos = (uint16_t)iVar14;
      run_container_add(local_40,pos);
      iVar9 = container_02->cardinality;
      if (((long)iVar9 == 0) ||
         ((puVar3 = container_02->array, iVar9 != 0x7fffffff && (puVar3[(long)iVar9 + -1] < pos))))
      {
        if (iVar9 == container_02->capacity) {
          array_container_grow(container_02,iVar9 + 1,true);
          iVar9 = container_02->cardinality;
        }
        container_02->cardinality = iVar9 + 1;
        container_02->array[iVar9] = pos;
      }
      else {
        if (iVar9 < 1) {
          uVar11 = 0;
        }
        else {
          iVar10 = iVar9 + -1;
          uVar11 = 0;
          do {
            uVar15 = iVar10 + (int)uVar11;
            uVar2 = uVar15 >> 1;
            uVar8 = *(ushort *)((long)puVar3 + (ulong)(uVar15 & 0xfffffffe));
            if (uVar8 < pos) {
              uVar11 = (ulong)(uVar2 + 1);
            }
            else {
              if (uVar8 <= pos) goto LAB_00105597;
              iVar10 = uVar2 - 1;
            }
          } while ((int)uVar11 <= iVar10);
          if (iVar9 == 0x7fffffff) goto LAB_00105597;
        }
        if (iVar9 == container_02->capacity) {
          array_container_grow(container_02,iVar9 + 1,true);
          puVar3 = container_02->array;
        }
        memmove(puVar3 + uVar11 + 1,puVar3 + uVar11,(long)(iVar9 - (int)uVar11) * 2);
        container_02->array[uVar11] = pos;
        container_02->cardinality = container_02->cardinality + 1;
      }
    }
LAB_00105597:
    uVar13 = (uVar13 * 0xd68 + 0x1a85) % 0x26f5;
    iVar14 = iVar14 + 1;
    if (iVar14 == 0x10000) {
      local_38 = (unsigned_long)container_03->cardinality;
      local_50 = (array_container_t *)0x0;
      prVar4 = run_container_clone(run);
      _Var1 = run_bitset_container_ixor(prVar4,src_2,&local_50);
      _assert_true((ulong)!_Var1,"run_bitset_container_ixor(temp_r, B1, &C)",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                   ,0x3b4);
      _assert_int_equal(0,(long)local_50->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x3b5);
      array_container_free(local_50);
      local_50 = (array_container_t *)0x0;
      pbVar5 = bitset_container_create();
      bitset_container_copy(src_2,pbVar5);
      _Var1 = bitset_run_container_ixor(pbVar5,run,&local_50);
      _assert_true((ulong)!_Var1,"bitset_run_container_ixor(temp_b, R1, &C)",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                   ,0x3bb);
      _assert_int_equal(0,(long)local_50->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x3bc);
      array_container_free(local_50);
      local_50 = (array_container_t *)0x0;
      paVar6 = array_container_clone(container);
      iVar14 = array_run_container_ixor(paVar6,run,&local_50);
      _assert_int_equal(2,(long)iVar14,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x3c2);
      _assert_int_equal(0,(long)local_50->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x3c3);
      array_container_free(local_50);
      local_50 = (array_container_t *)0x0;
      prVar4 = run_container_clone(run);
      iVar14 = run_array_container_ixor(prVar4,container,&local_50);
      _assert_int_equal(2,(long)iVar14,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x3c9);
      _assert_int_equal(0,(long)local_50->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x3ca);
      array_container_free(local_50);
      local_50 = (array_container_t *)0x0;
      prVar4 = run_container_clone(run);
      iVar14 = run_run_container_ixor(prVar4,run,&local_50);
      _assert_int_not_equal
                (1,(long)iVar14,
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                 ,0x3d2);
      if (iVar14 == 3) {
        iVar14 = run_container_cardinality((run_container_t *)local_50);
        _assert_int_equal(0,(long)iVar14,
                          "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                          ,0x3d4);
        run_container_free((run_container_t *)local_50);
      }
      else {
        _assert_int_equal(0,(long)local_50->cardinality,
                          "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                          ,0x3d7);
        array_container_free(local_50);
      }
      local_50 = (array_container_t *)0x0;
      prVar4 = run_container_clone(run);
      _Var1 = run_bitset_container_ixor(prVar4,src_2_01,&local_50);
      _assert_true((ulong)!_Var1,"run_bitset_container_ixor(temp_r, B3, &C)",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                   ,0x3dd);
      _assert_int_equal(2000,(long)local_50->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x3de);
      array_container_free(local_50);
      local_50 = (array_container_t *)0x0;
      paVar6 = array_container_clone(container_01);
      iVar14 = array_run_container_ixor(paVar6,run,&local_50);
      _assert_int_equal(2,(long)iVar14,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x3e4);
      _assert_int_equal(2000,(long)local_50->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x3e5);
      array_container_free(local_50);
      local_50 = (array_container_t *)0x0;
      pbVar5 = bitset_container_create();
      bitset_container_copy(src_2,pbVar5);
      _Var1 = bitset_run_container_ixor(pbVar5,run_01,&local_50);
      _assert_true((ulong)!_Var1,"bitset_run_container_ixor(temp_b, R3, &C)",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                   ,0x3eb);
      _assert_int_equal(2000,(long)local_50->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x3ec);
      array_container_free(local_50);
      local_50 = (array_container_t *)0x0;
      prVar4 = run_container_clone(run_01);
      iVar14 = run_array_container_ixor(prVar4,container,&local_50);
      _assert_int_equal(2,(long)iVar14,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x3f2);
      _assert_int_equal(2000,(long)local_50->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x3f3);
      array_container_free(local_50);
      local_50 = (array_container_t *)0x0;
      prVar4 = run_container_clone(run);
      iVar14 = run_run_container_ixor(prVar4,run_01,&local_50);
      _assert_int_equal(2,(long)iVar14,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x3f9);
      _assert_int_equal(2000,(long)local_50->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x3fa);
      array_container_free(local_50);
      local_50 = (array_container_t *)0x0;
      prVar4 = run_container_clone(run);
      _Var1 = run_bitset_container_ixor(prVar4,src_2_00,&local_50);
      _assert_true((ulong)_Var1,"run_bitset_container_ixor(temp_r, B2, &C)",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                   ,0x3ff);
      uVar18 = local_38;
      _assert_int_equal(local_38,(long)local_50->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x400);
      bitset_container_free((bitset_container_t *)local_50);
      local_50 = (array_container_t *)0x0;
      paVar6 = array_container_clone(container_00);
      iVar14 = array_run_container_ixor(paVar6,run,&local_50);
      _assert_int_equal(1,(long)iVar14,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x406);
      _assert_int_equal(uVar18,(long)local_50->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x407);
      bitset_container_free((bitset_container_t *)local_50);
      local_50 = (array_container_t *)0x0;
      pbVar5 = bitset_container_create();
      bitset_container_copy(src_2,pbVar5);
      _Var1 = bitset_run_container_ixor(pbVar5,run_00,&local_50);
      _assert_true((ulong)_Var1,"bitset_run_container_ixor(temp_b, R2, &C)",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                   ,0x40d);
      _assert_int_equal(uVar18,(long)local_50->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x40e);
      bitset_container_free((bitset_container_t *)local_50);
      local_50 = (array_container_t *)0x0;
      prVar4 = run_container_clone(run);
      iVar14 = run_array_container_ixor(prVar4,container_00,&local_50);
      _assert_int_equal(1,(long)iVar14,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x414);
      _assert_int_equal(uVar18,(long)local_50->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x415);
      bitset_container_free((bitset_container_t *)local_50);
      local_50 = (array_container_t *)0x0;
      prVar4 = run_container_clone(run);
      iVar14 = run_run_container_ixor(prVar4,run_00,&local_50);
      _assert_int_equal(1,(long)iVar14,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x41b);
      _assert_int_equal(uVar18,(long)local_50->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x41c);
      bitset_container_free((bitset_container_t *)local_50);
      prVar4 = local_40;
      local_50 = (array_container_t *)0x0;
      prVar7 = run_container_clone(local_40);
      _Var1 = run_bitset_container_ixor(prVar7,src_2_01,&local_50);
      _assert_true((ulong)_Var1,"run_bitset_container_ixor(temp_r, B3, &C)",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                   ,0x421);
      uVar18 = (unsigned_long)local_50->cardinality;
      bitset_container_free((bitset_container_t *)local_50);
      local_50 = (array_container_t *)0x0;
      paVar6 = array_container_clone(container_01);
      iVar14 = array_run_container_ixor(paVar6,prVar4,&local_50);
      _assert_int_equal(1,(long)iVar14,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x429);
      _assert_int_equal(uVar18,(long)local_50->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x42b);
      bitset_container_free((bitset_container_t *)local_50);
      local_50 = (array_container_t *)0x0;
      pbVar5 = bitset_container_create();
      bitset_container_copy(src_2_01,pbVar5);
      _Var1 = bitset_run_container_ixor(pbVar5,prVar4,&local_50);
      _assert_true((ulong)_Var1,"bitset_run_container_ixor(temp_b, R4, &C)",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                   ,0x431);
      _assert_int_equal(uVar18,(long)local_50->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x432);
      bitset_container_free((bitset_container_t *)local_50);
      local_50 = (array_container_t *)0x0;
      prVar7 = run_container_clone(run_01);
      iVar14 = run_array_container_ixor(prVar7,container_02,&local_50);
      _assert_int_equal(1,(long)iVar14,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x438);
      _assert_int_equal(uVar18,(long)local_50->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x439);
      bitset_container_free((bitset_container_t *)local_50);
      local_50 = (array_container_t *)0x0;
      prVar7 = run_container_clone(prVar4);
      iVar14 = run_run_container_ixor(prVar7,run_01,&local_50);
      _assert_int_equal(1,(long)iVar14,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x43f);
      _assert_int_equal(uVar18,(long)local_50->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x440);
      bitset_container_free((bitset_container_t *)local_50);
      local_50 = (array_container_t *)0x0;
      array_container_free(container);
      array_container_free(container_00);
      array_container_free(container_01);
      array_container_free(container_03);
      array_container_free(container_02);
      bitset_container_free(src_2);
      bitset_container_free(src_2_00);
      bitset_container_free(src_2_01);
      bitset_container_free(local_48);
      run_container_free(run);
      run_container_free(run_00);
      run_container_free(run_01);
      run_container_free(prVar4);
      return;
    }
  } while( true );
}

Assistant:

DEFINE_TEST(run_ixor_test) {
    array_container_t* A1 = array_container_create();
    array_container_t* A2 = array_container_create();
    array_container_t* A3 = array_container_create();
    array_container_t* A4 = array_container_create();
    array_container_t* AX = array_container_create();
    bitset_container_t* B1 = bitset_container_create();
    bitset_container_t* B2 = bitset_container_create();
    bitset_container_t* B3 = bitset_container_create();
    bitset_container_t* BX = bitset_container_create();
    run_container_t* R1 = run_container_create();
    run_container_t* R2 = run_container_create();
    run_container_t* R3 = run_container_create();
    run_container_t* R4 = run_container_create();

    // B/A1 xor R1 is empty (array or run, I guess)
    // B/A1 xor R2 is probably best left as runs
    // B/A3 xor R1 is best as an array.
    // B/A3 xor R4 is best as a bitmap

    // nb, array containers will be illegally big.
    for (int x = 0; x < (1 << 16); x++) {
        if (x % 5 < 3) {
            array_container_add(A1, x);
            bitset_container_set(B1, x);
            run_container_add(R1, x);
        }
    }

    for (int x = 0; x < (1 << 16); x++) {
        if (x % 62 < 37) {
            array_container_add(A2, x);
            bitset_container_set(B2, x);
            run_container_add(R2, x);
        }
    }

    for (int x = 0; x < (1 << 16); x++)
        if ((x % 62 < 37) ^ (x % 5 < 3)) {
            array_container_add(AX, x);
            bitset_container_set(BX, x);
        }

    // the elements x%5 == 2 differ for less than 10k, otherwise same)
    for (int x = 0; x < (1 << 16); x++) {
        if ((x % 5 < 2) || ((x % 5 < 3) && (x > 10000))) {
            array_container_add(A3, x);
            bitset_container_set(B3, x);
            run_container_add(R3, x);
        }
    }

    int randstate = 1;  // for Oakenfull RNG, hope LSBits are nice
    for (int x = 0; x < (1 << 16); x++) {
        if (randstate % 4) {
            run_container_add(R4, x);
            array_container_add(A4, x);
        }
        randstate = (3432 * randstate + 6789) % 9973;
    }

    int cx12 = array_container_cardinality(AX);  // expected xor for ?1 and ?2

    container_t* C = NULL;

    run_container_t* temp_r = run_container_clone(R1);
    assert_false(run_bitset_container_ixor(temp_r, B1, &C));
    assert_int_equal(0, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    bitset_container_t* temp_b = bitset_container_create();
    bitset_container_copy(B1, temp_b);
    assert_false(bitset_run_container_ixor(temp_b, R1, &C));
    assert_int_equal(0, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    array_container_t* temp_a = array_container_clone(A1);
    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     array_run_container_ixor(temp_a, R1, &C));
    assert_int_equal(0, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    temp_r = run_container_clone(R1);
    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     run_array_container_ixor(temp_r, A1, &C));
    assert_int_equal(0, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    // both run coding and array coding have same serialized size for
    // empty
    temp_r = run_container_clone(R1);
    int ret_type = run_run_container_ixor(temp_r, R1, &C);
    assert_int_not_equal(BITSET_CONTAINER_TYPE, ret_type);
    if (ret_type == RUN_CONTAINER_TYPE) {
        assert_int_equal(0, run_container_cardinality(CAST_run(C)));
        run_container_free(CAST_run(C));
    } else {
        assert_int_equal(0, array_container_cardinality(CAST_array(C)));
        array_container_free(CAST_array(C));
    }
    C = NULL;

    temp_r = run_container_clone(R1);
    assert_false(run_bitset_container_ixor(temp_r, B3, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    temp_a = array_container_clone(A3);
    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     array_run_container_ixor(temp_a, R1, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    temp_b = bitset_container_create();
    bitset_container_copy(B1, temp_b);
    assert_false(bitset_run_container_ixor(temp_b, R3, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    temp_r = run_container_clone(R3);
    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     run_array_container_ixor(temp_r, A1, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    temp_r = run_container_clone(R1);
    assert_int_equal(ARRAY_CONTAINER_TYPE,
                     run_run_container_ixor(temp_r, R3, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    temp_r = run_container_clone(R1);
    assert_true(run_bitset_container_ixor(temp_r, B2, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_a = array_container_clone(A2);
    assert_int_equal(BITSET_CONTAINER_TYPE,
                     array_run_container_ixor(temp_a, R1, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_b = bitset_container_create();
    bitset_container_copy(B1, temp_b);
    assert_true(bitset_run_container_ixor(temp_b, R2, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_r = run_container_clone(R1);
    assert_int_equal(BITSET_CONTAINER_TYPE,
                     run_array_container_ixor(temp_r, A2, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_r = run_container_clone(R1);
    assert_int_equal(BITSET_CONTAINER_TYPE,
                     run_run_container_ixor(temp_r, R2, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_r = run_container_clone(R4);
    assert_true(run_bitset_container_ixor(temp_r, B3, &C));
    int card_3_4 = bitset_container_cardinality(CAST_bitset(C));
    // assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_a = array_container_clone(A3);
    assert_int_equal(BITSET_CONTAINER_TYPE,
                     array_run_container_ixor(temp_a, R4, &C));
    // if this fails, either this bitset is wrong or the previous one...
    assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_b = bitset_container_create();
    bitset_container_copy(B3, temp_b);
    assert_true(bitset_run_container_ixor(temp_b, R4, &C));
    assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_r = run_container_clone(R3);
    assert_int_equal(BITSET_CONTAINER_TYPE,
                     run_array_container_ixor(temp_r, A4, &C));
    assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    temp_r = run_container_clone(R4);
    assert_int_equal(BITSET_CONTAINER_TYPE,
                     run_run_container_ixor(temp_r, R3, &C));
    assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    array_container_free(A1);
    array_container_free(A2);
    array_container_free(A3);
    array_container_free(AX);
    array_container_free(A4);

    bitset_container_free(B1);
    bitset_container_free(B2);
    bitset_container_free(B3);
    bitset_container_free(BX);

    run_container_free(R1);
    run_container_free(R2);
    run_container_free(R3);
    run_container_free(R4);
}